

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O2

bool __thiscall pbrt::BSDF::IsGlossy(BSDF *this)

{
  BxDFFlags BVar1;
  
  BVar1 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::BSSRDFAdapter>
          ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::BSSRDFAdapter>
                      *)&this->bxdf);
  return SUB41((BVar1 & Glossy) >> 3,0);
}

Assistant:

PBRT_CPU_GPU
    bool IsGlossy() const { return (bxdf.Flags() & BxDFFlags::Glossy); }